

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O3

void __thiscall
neueda::cdr::findInChildren
          (cdr *this,orderedItemMap *items,cdrKey_t *key,
          vector<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_> *found)

{
  pointer *pppcVar1;
  iterator __position;
  cdrItem *in_RAX;
  cdrItem *pcVar2;
  _Rb_tree_node_base *p_Var3;
  pointer pcVar4;
  cdrItem *item;
  cdrItem *local_38;
  
  p_Var3 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &(items->_M_t)._M_impl.super__Rb_tree_header) {
    pcVar2 = (cdrItem *)p_Var3[1]._M_parent;
    local_38 = in_RAX;
    if (pcVar2->mKey == *key) {
      local_38 = pcVar2;
      if (pcVar2->mType == CDR_ARRAY) {
        for (pcVar4 = (pcVar2->mArray).super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar4 != (pcVar2->mArray).super__Vector_base<neueda::cdr,_std::allocator<neueda::cdr>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pcVar4 = pcVar4 + 1) {
          findInChildren(this,&pcVar4->mOrdered,key,found);
          pcVar2 = (cdrItem *)p_Var3[1]._M_parent;
        }
      }
      else {
        __position._M_current =
             (found->
             super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (found->
            super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<neueda::cdrItem_const*,std::allocator<neueda::cdrItem_const*>>::
          _M_realloc_insert<neueda::cdrItem_const*const&>
                    ((vector<neueda::cdrItem_const*,std::allocator<neueda::cdrItem_const*>> *)found,
                     __position,&local_38);
        }
        else {
          *__position._M_current = pcVar2;
          pppcVar1 = &(found->
                      super__Vector_base<const_neueda::cdrItem_*,_std::allocator<const_neueda::cdrItem_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    in_RAX = local_38;
  }
  return;
}

Assistant:

void
cdr::findInChildren (const orderedItemMap* items,
                     const cdrKey_t& key,
                     vector<const cdrItem*>& found) const
{
    orderedItemMap::const_iterator it0 = items->begin ();
    for (; it0 != items->end (); ++it0)
    {
        if (it0->second->mKey != key)
            continue;
        const cdrItem* item = it0->second;
        if (it0->second->mType == CDR_ARRAY)
        {
            vector<cdr>::const_iterator it = item->mArray.begin ();
            for (; it != it0->second->mArray.end (); ++it)
                findInChildren (&it->mOrdered, key, found);
        }
        else
            found.push_back (item);
    }
}